

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void ImplementGapWarning(SstStream Stream,FFSArrayRequest_conflict Req)

{
  range_list start_00;
  long *in_RSI;
  long in_RDI;
  size_t end;
  size_t start;
  int i;
  _range_list *Required;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  if (((int)in_RSI[1] != 1) && (*(long *)(*in_RSI + 0x18) == 1)) {
    start_00 = (range_list)malloc(0x18);
    start_00->next = (_range_list *)0x0;
    start_00->start = *(size_t *)in_RSI[3];
    start_00->end = (*(long *)in_RSI[3] + *(long *)in_RSI[4]) - 1;
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x238); iVar1 = iVar1 + 1) {
      start_00 = OneDCoverage((size_t)start_00,CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              (range_list)
                              **(undefined8 **)(*(long *)(*in_RSI + 0x40) + (long)iVar1 * 8));
    }
    if (start_00 != (range_list)0x0) {
      printf("WARNING:   Reader Rank %d requested elements %zu - %zu,\n\tbut these elements were not written by any writer rank: \n"
             ,(ulong)*(uint *)(in_RDI + 0xa8),*(undefined8 *)in_RSI[3],
             *(long *)in_RSI[3] + *(long *)in_RSI[4] + -1);
      DumpCoverageList((range_list)0x12701c);
    }
  }
  return;
}

Assistant:

static void ImplementGapWarning(SstStream Stream, FFSArrayRequest Req)
{
    if (Req->RequestType == Local)
    {
        /* no analysis here */
        return;
    }
    if (Req->VarRec->DimCount != 1)
    {
        /* at this point, multidimensional fill analysis is too much */
        return;
    }
    struct _range_list *Required = malloc(sizeof(*Required));
    Required->next = NULL;
    Required->start = Req->Start[0];
    Required->end = Req->Start[0] + Req->Count[0] - 1;
    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        size_t start = Req->VarRec->PerWriterStart[i][0];
        size_t end = start + Req->VarRec->PerWriterCounts[i][0] - 1;
        Required = OneDCoverage(start, end, Required);
    }
    if (Required != NULL)
    {
        printf("WARNING:   Reader Rank %d requested elements %zu - %zu,\n\tbut "
               "these elements were not written by any writer rank: \n",
               Stream->Rank, Req->Start[0], Req->Start[0] + Req->Count[0] - 1);
        DumpCoverageList(Required);
    }
}